

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O0

void helics::loadPropertiesJson<helics::Filter>(Federate *fed,Filter *iface,json *json,bool strict)

{
  string_view message;
  string_view message_00;
  string_view message_01;
  string_view message_02;
  string_view message_03;
  string_view message_04;
  long *plVar1;
  bool bVar2;
  undefined8 uVar3;
  const_reference this;
  byte in_CL;
  long *in_RSI;
  double dVar4;
  __sv_type _Var5;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  *prop;
  const_iterator __end4;
  const_iterator __begin4;
  value_type *__range4;
  value_type *props;
  iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
  *in_stack_fffffffffffffd78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  *in_stack_fffffffffffffd88;
  InvalidParameter *in_stack_fffffffffffffd90;
  char (*in_stack_fffffffffffffd98) [11];
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  *in_stack_fffffffffffffda0;
  undefined8 in_stack_fffffffffffffda8;
  int iVar6;
  Federate *in_stack_fffffffffffffdb0;
  long *in_stack_fffffffffffffdb8;
  char *in_stack_fffffffffffffdc0;
  const_reference in_stack_fffffffffffffdc8;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  *in_stack_fffffffffffffdd0;
  iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
  *in_stack_fffffffffffffe08;
  size_t local_1e8;
  char *local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  __sv_type local_1b8;
  __sv_type local_188;
  size_t local_178;
  char *local_170;
  size_t local_168;
  char *local_160;
  size_t local_158;
  char *local_150;
  __sv_type local_128;
  char local_118 [32];
  __sv_type local_f8;
  __sv_type local_b8;
  size_t local_a8;
  char *local_a0;
  size_t local_98;
  char *local_90;
  size_t local_88;
  char *local_80;
  reference local_78;
  const_reference local_30;
  const_reference local_28;
  byte local_19;
  long *local_10;
  
  local_19 = in_CL & 1;
  local_10 = in_RSI;
  bVar2 = nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::contains<const_char_(&)[11],_0>(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
  if (bVar2) {
    local_28 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               ::operator[]<char_const>(in_stack_fffffffffffffdd0,(char *)in_stack_fffffffffffffdc8)
    ;
    bVar2 = nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::is_array(local_28);
    iVar6 = (int)((ulong)in_stack_fffffffffffffda8 >> 0x20);
    if (bVar2) {
      local_30 = local_28;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::begin((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
               *)in_stack_fffffffffffffd78);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::end((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
             *)in_stack_fffffffffffffd78);
      while (bVar2 = nlohmann::json_abi_v3_11_3::detail::
                     iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                     ::
                     operator!=<nlohmann::json_abi_v3_11_3::detail::iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_nullptr>
                               ((iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                                 *)in_stack_fffffffffffffd80,in_stack_fffffffffffffd78), bVar2) {
        local_78 = nlohmann::json_abi_v3_11_3::detail::
                   iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                   ::operator*(in_stack_fffffffffffffe08);
        bVar2 = nlohmann::json_abi_v3_11_3::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                ::contains<const_char_(&)[5],_0>
                          (in_stack_fffffffffffffda0,(char (*) [5])in_stack_fffffffffffffd98);
        if ((bVar2) &&
           (bVar2 = nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    ::contains<const_char_(&)[6],_0>
                              (in_stack_fffffffffffffda0,(char (*) [6])in_stack_fffffffffffffd98),
           bVar2)) {
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
          ::operator[]<char_const>(in_stack_fffffffffffffdd0,(char *)in_stack_fffffffffffffdc8);
          bVar2 = nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  ::is_number((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                               *)in_stack_fffffffffffffd80);
          plVar1 = local_10;
          if (bVar2) {
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
            ::operator[]<char_const>(in_stack_fffffffffffffdd0,(char *)in_stack_fffffffffffffdc8);
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
            ::get<std::__cxx11::string,std::__cxx11::string>(in_stack_fffffffffffffd88);
            local_b8 = std::__cxx11::string::operator_cast_to_basic_string_view
                                 (in_stack_fffffffffffffd80);
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
            ::operator[]<char_const>(in_stack_fffffffffffffdd0,(char *)in_stack_fffffffffffffdc8);
            in_stack_fffffffffffffdd0 =
                 (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                    ::get<double,double>
                              ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                *)in_stack_fffffffffffffd80);
            (**(code **)(*plVar1 + 0x28))
                      (in_stack_fffffffffffffdd0,plVar1,local_b8._M_len,local_b8._M_str);
            std::__cxx11::string::~string(in_stack_fffffffffffffd80);
          }
          else {
            in_stack_fffffffffffffdb8 = local_10;
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
            ::operator[]<char_const>(in_stack_fffffffffffffdd0,(char *)in_stack_fffffffffffffdc8);
            in_stack_fffffffffffffdc0 = local_118;
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
            ::get<std::__cxx11::string,std::__cxx11::string>(in_stack_fffffffffffffd88);
            local_f8 = std::__cxx11::string::operator_cast_to_basic_string_view
                                 (in_stack_fffffffffffffd80);
            in_stack_fffffffffffffdc8 =
                 nlohmann::json_abi_v3_11_3::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                 ::operator[]<char_const>
                           (in_stack_fffffffffffffdd0,(char *)in_stack_fffffffffffffdc8);
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
            ::get<std::__cxx11::string,std::__cxx11::string>(in_stack_fffffffffffffd88);
            local_128 = std::__cxx11::string::operator_cast_to_basic_string_view
                                  (in_stack_fffffffffffffd80);
            (**(code **)(*in_stack_fffffffffffffdb8 + 0x30))
                      (in_stack_fffffffffffffdb8,local_f8._M_len,local_f8._M_str,local_128._M_len,
                       local_128._M_str);
            std::__cxx11::string::~string(in_stack_fffffffffffffd80);
            std::__cxx11::string::~string(in_stack_fffffffffffffd80);
          }
        }
        else {
          iVar6 = (int)((ulong)in_stack_fffffffffffffda8 >> 0x20);
          if ((local_19 & 1) != 0) {
            local_88 = 0x36;
            local_80 = "interface properties require \"name\" and \"value\" fields";
            message_01._M_str = in_stack_fffffffffffffdc0;
            message_01._M_len = (size_t)in_stack_fffffffffffffdb8;
            Federate::logMessage(in_stack_fffffffffffffdb0,iVar6,message_01);
            uVar3 = __cxa_allocate_exception(0x28);
            local_98 = 0x36;
            local_90 = "interface properties require \"name\" and \"value\" fields";
            message._M_str = (char *)in_stack_fffffffffffffda0;
            message._M_len = (size_t)in_stack_fffffffffffffd98;
            InvalidParameter::InvalidParameter(in_stack_fffffffffffffd90,message);
            __cxa_throw(uVar3,&InvalidParameter::typeinfo,InvalidParameter::~InvalidParameter);
          }
          local_a8 = 0x36;
          local_a0 = "interface properties require \"name\" and \"value\" fields";
          message_02._M_str = in_stack_fffffffffffffdc0;
          message_02._M_len = (size_t)in_stack_fffffffffffffdb8;
          Federate::logMessage(in_stack_fffffffffffffdb0,iVar6,message_02);
        }
        nlohmann::json_abi_v3_11_3::detail::
        iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
        ::operator++((iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                      *)in_stack_fffffffffffffd80);
      }
    }
    else {
      bVar2 = nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::contains<const_char_(&)[5],_0>
                        (in_stack_fffffffffffffda0,(char (*) [5])in_stack_fffffffffffffd98);
      if ((bVar2) &&
         (bVar2 = nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  ::contains<const_char_(&)[6],_0>
                            (in_stack_fffffffffffffda0,(char (*) [6])in_stack_fffffffffffffd98),
         bVar2)) {
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
        ::operator[]<char_const>(in_stack_fffffffffffffdd0,(char *)in_stack_fffffffffffffdc8);
        bVar2 = nlohmann::json_abi_v3_11_3::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                ::is_number((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                             *)in_stack_fffffffffffffd80);
        if (bVar2) {
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
          ::operator[]<char_const>(in_stack_fffffffffffffdd0,(char *)in_stack_fffffffffffffdc8);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
          ::get<std::__cxx11::string,std::__cxx11::string>(in_stack_fffffffffffffd88);
          local_188 = std::__cxx11::string::operator_cast_to_basic_string_view
                                (in_stack_fffffffffffffd80);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
          ::operator[]<char_const>(in_stack_fffffffffffffdd0,(char *)in_stack_fffffffffffffdc8);
          dVar4 = nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                  ::get<double,double>
                            ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                              *)in_stack_fffffffffffffd80);
          (**(code **)(*local_10 + 0x28))(dVar4,local_10,local_188._M_len,local_188._M_str);
          std::__cxx11::string::~string(in_stack_fffffffffffffd80);
        }
        else {
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
          ::operator[]<char_const>(in_stack_fffffffffffffdd0,(char *)in_stack_fffffffffffffdc8);
          this_00 = &local_1d8;
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
          ::get<std::__cxx11::string,std::__cxx11::string>(in_stack_fffffffffffffd88);
          local_1b8 = std::__cxx11::string::operator_cast_to_basic_string_view(this_00);
          this = nlohmann::json_abi_v3_11_3::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                 ::operator[]<char_const>
                           (in_stack_fffffffffffffdd0,(char *)in_stack_fffffffffffffdc8);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
          ::get<std::__cxx11::string,std::__cxx11::string>(this);
          _Var5 = std::__cxx11::string::operator_cast_to_basic_string_view(this_00);
          local_1e8 = _Var5._M_len;
          local_1e0 = _Var5._M_str;
          (**(code **)(*local_10 + 0x30))
                    (local_10,local_1b8._M_len,local_1b8._M_str,local_1e8,local_1e0);
          std::__cxx11::string::~string(this_00);
          std::__cxx11::string::~string(this_00);
        }
      }
      else {
        if ((local_19 & 1) != 0) {
          local_158 = 0x36;
          local_150 = "interface properties require \"name\" and \"value\" fields";
          message_03._M_str = in_stack_fffffffffffffdc0;
          message_03._M_len = (size_t)in_stack_fffffffffffffdb8;
          Federate::logMessage(in_stack_fffffffffffffdb0,iVar6,message_03);
          uVar3 = __cxa_allocate_exception(0x28);
          local_168 = 0x36;
          local_160 = "interface properties require \"name\" and \"value\" fields";
          message_00._M_str = (char *)in_stack_fffffffffffffda0;
          message_00._M_len = (size_t)in_stack_fffffffffffffd98;
          InvalidParameter::InvalidParameter(in_stack_fffffffffffffd90,message_00);
          __cxa_throw(uVar3,&InvalidParameter::typeinfo,InvalidParameter::~InvalidParameter);
        }
        local_178 = 0x36;
        local_170 = "interface properties require \"name\" and \"value\" fields";
        message_04._M_str = in_stack_fffffffffffffdc0;
        message_04._M_len = (size_t)in_stack_fffffffffffffdb8;
        Federate::logMessage(in_stack_fffffffffffffdb0,iVar6,message_04);
      }
    }
  }
  return;
}

Assistant:

static void
    loadPropertiesJson(Federate* fed, INTERFACE& iface, const nlohmann::json& json, bool strict)
{
    static constexpr std::string_view errorMessage =
        R"(interface properties require "name" and "value" fields)";
    if (json.contains("properties")) {
        const auto& props = json["properties"];
        if (props.is_array()) {
            for (const auto& prop : props) {
                if ((!prop.contains("name")) || (!prop.contains("value"))) {
                    if (strict) {
                        fed->logMessage(HELICS_LOG_LEVEL_ERROR, errorMessage);

                        throw(InvalidParameter(errorMessage));
                    }
                    fed->logMessage(HELICS_LOG_LEVEL_WARNING, errorMessage);
                    continue;
                }
                if (prop["value"].is_number()) {
                    iface.set(prop["name"].get<std::string>(), prop["value"].get<double>());
                } else {
                    iface.setString(prop["name"].get<std::string>(),
                                    prop["value"].get<std::string>());
                }
            }
        } else {
            if ((!props.contains("name")) || (!props.contains("value"))) {
                if (strict) {
                    fed->logMessage(HELICS_LOG_LEVEL_ERROR, errorMessage);

                    throw(InvalidParameter(errorMessage));
                }
                fed->logMessage(HELICS_LOG_LEVEL_WARNING, errorMessage);
            } else {
                if (props["value"].is_number()) {
                    iface.set(props["name"].get<std::string>(), props["value"].get<double>());
                } else {
                    iface.setString(props["name"].get<std::string>(),
                                    props["value"].get<std::string>());
                }
            }
        }
    }
}